

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O1

int __thiscall FBehavior::GetArrayVal(FBehavior *this,int arraynum,int index)

{
  int iVar1;
  
  iVar1 = 0;
  if (((uint)arraynum < (uint)this->NumTotalArrays) &&
     (iVar1 = 0, (uint)index < this->Arrays[arraynum]->ArraySize)) {
    iVar1 = this->Arrays[arraynum]->Elements[index];
  }
  return iVar1;
}

Assistant:

int FBehavior::GetArrayVal (int arraynum, int index) const
{
	if ((unsigned)arraynum >= (unsigned)NumTotalArrays)
		return 0;
	const ArrayInfo *array = Arrays[arraynum];
	if ((unsigned)index >= (unsigned)array->ArraySize)
		return 0;
	return array->Elements[index];
}